

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::ImFont(ImFont *this)

{
  long in_RDI;
  ImFont *this_00;
  ImVec2 local_1c [3];
  
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 8));
  ImVector<ImFontGlyph>::ImVector((ImVector<ImFontGlyph> *)(in_RDI + 0x10));
  ImVector<float>::ImVector((ImVector<float> *)(in_RDI + 0x20));
  this_00 = (ImFont *)(in_RDI + 0x30);
  ImVector<unsigned_short>::ImVector((ImVector<unsigned_short> *)this_00);
  *(undefined4 *)(in_RDI + 4) = 0x3f800000;
  *(undefined2 *)(in_RDI + 0x4c) = 0x3f;
  ImVec2::ImVec2(local_1c,0.0,0.0);
  *(ImVec2 *)(in_RDI + 8) = local_1c[0];
  ClearOutputData(this_00);
  return;
}

Assistant:

ImFont::ImFont()
{
    Scale = 1.0f;
    FallbackChar = (ImWchar)'?';
    DisplayOffset = ImVec2(0.0f, 0.0f);
    ClearOutputData();
}